

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

void Fra_ClausSimInfoRealloc(Clu_Man_t *p)

{
  Clu_Man_t *p_local;
  
  if (p->nCexes == p->nCexesAlloc) {
    Vec_PtrReallocSimInfo(p->vCexes);
    Vec_PtrCleanSimInfo(p->vCexes,p->nCexesAlloc / 0x20,(p->nCexesAlloc << 1) / 0x20);
    p->nCexesAlloc = p->nCexesAlloc << 1;
    return;
  }
  __assert_fail("p->nCexes == p->nCexesAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                ,0x3f3,"void Fra_ClausSimInfoRealloc(Clu_Man_t *)");
}

Assistant:

void Fra_ClausSimInfoRealloc( Clu_Man_t * p )
{
    assert( p->nCexes == p->nCexesAlloc );
    Vec_PtrReallocSimInfo( p->vCexes );
    Vec_PtrCleanSimInfo( p->vCexes, p->nCexesAlloc/32, 2 * p->nCexesAlloc/32 );
    p->nCexesAlloc *= 2;
}